

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::erase_selected_element(Mesh *this)

{
  Scene *pSVar1;
  HalfedgeElement *this_00;
  XFormWidget *pXVar2;
  Vertex *pVVar3;
  Edge *pEVar4;
  FaceIter FVar5;
  
  pSVar1 = (this->super_SceneObject).scene;
  if ((pSVar1 != (Scene *)0x0) &&
     (this_00 = (pSVar1->selected).element, this_00 != (HalfedgeElement *)0x0)) {
    pVVar3 = HalfedgeElement::getVertex(this_00);
    pEVar4 = HalfedgeElement::getEdge(this_00);
    if (pEVar4 == (Edge *)0x0) {
      if (pVVar3 == (Vertex *)0x0) {
        return;
      }
      FVar5 = HalfedgeMesh::eraseVertex(&this->mesh,(pVVar3->_halfedge)._M_node[2]._M_prev);
    }
    else {
      FVar5 = HalfedgeMesh::eraseEdge(&this->mesh,(pEVar4->_halfedge)._M_node[3]._M_next);
    }
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->selected).coordinates.x = 0.0;
    (pSVar1->selected).coordinates.y = 0.0;
    (pSVar1->selected).object = (SceneObject *)0x0;
    (pSVar1->selected).element = (HalfedgeElement *)0x0;
    (pSVar1->selected).coordinates.z = 0.0;
    (pSVar1->selected).axis = None;
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->selected).object = &this->super_SceneObject;
    (pSVar1->selected).element = (HalfedgeElement *)(FVar5._M_node + 1);
    (pSVar1->hovered).object = (SceneObject *)0x0;
    (pSVar1->hovered).element = (HalfedgeElement *)0x0;
    (pSVar1->hovered).coordinates.x = 0.0;
    (pSVar1->hovered).coordinates.y = 0.0;
    (pSVar1->hovered).coordinates.z = 0.0;
    (pSVar1->hovered).axis = None;
    pXVar2 = ((this->super_SceneObject).scene)->elementTransform;
    (pXVar2->target).coordinates.x = 0.0;
    (pXVar2->target).coordinates.y = 0.0;
    (pXVar2->target).object = (SceneObject *)0x0;
    (pXVar2->target).element = (HalfedgeElement *)0x0;
    (pXVar2->target).coordinates.z = 0.0;
    (pXVar2->target).axis = None;
  }
  return;
}

Assistant:

void Mesh::erase_selected_element() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Vertex* vertex = element->getVertex();
   Edge* edge = element->getEdge();
   FaceIter f;
   if (edge != nullptr)
   {
      f = mesh.eraseEdge(edge->halfedge()->edge());
   }
   else if( vertex != nullptr )
   {
      f = mesh.eraseVertex(vertex->halfedge()->vertex());
   }
   else
   {
      return;
   }
   scene->selected.clear();
   scene->selected.object = this;
   scene->selected.element = elementAddress( f );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}